

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O3

vec2 __thiscall CTextRender::CaretPosition(CTextRender *this,CTextCursor *pCursor,int NumChars)

{
  int iVar1;
  IGraphics *pIVar2;
  CScaledGlyph *pCVar3;
  vec2 vVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  float fVar8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar10;
  float fVar11;
  float fVar12;
  vec2 vVar13;
  float fVar14;
  float LineWidth;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float local_44;
  float local_40;
  undefined1 local_3c [4];
  float local_38;
  undefined1 local_34 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = this->m_pGraphics;
  iVar1 = pIVar2->m_ScreenHeight;
  (*(pIVar2->super_IInterface)._vptr_IInterface[6])(pIVar2,local_34,&local_38,local_3c,&local_40);
  fVar11 = (float)iVar1 / (local_40 - local_38);
  fVar14 = pCursor->m_FontSize;
  iVar1 = (pCursor->m_Glyphs).num_elements;
  iVar5 = (*(this->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface
            [0x12])(this,pCursor,(ulong)(uint)NumChars,&local_44);
  uVar7 = pCursor->m_Align & 3;
  uVar6 = pCursor->m_Align & 0xc;
  if (uVar7 == 1) {
    fVar8 = pCursor->m_Width * -0.5;
    fVar12 = (pCursor->m_Width - local_44) * 0.5;
  }
  else {
    fVar8 = 0.0;
    fVar12 = 0.0;
    if (uVar7 == 2) {
      fVar8 = -pCursor->m_Width;
      fVar12 = pCursor->m_Width - local_44;
    }
  }
  fVar11 = (float)(int)(fVar14 * fVar11) / fVar11;
  if (uVar6 == 4) {
    fVar14 = fVar11 * 0.675 + pCursor->m_Height * -0.5;
  }
  else {
    fVar14 = 0.0;
    if (uVar6 == 8) {
      fVar14 = fVar11 * 1.35 - pCursor->m_Height;
    }
  }
  if (iVar1 == 0 || iVar5 == 0) {
    vVar13 = pCursor->m_CursorPos;
  }
  else {
    if (iVar5 < iVar1) {
      vVar13 = (pCursor->m_Glyphs).list[iVar5].m_Advance;
      aVar9.x = fVar8 + vVar13.field_0.x + (pCursor->m_CursorPos).field_0.x;
      aVar10.y = fVar14 + vVar13.field_1.y + (pCursor->m_CursorPos).field_1.y;
      goto LAB_00132438;
    }
    pCVar3 = (pCursor->m_Glyphs).list;
    fVar8 = fVar8 + pCVar3[(long)iVar1 + -1].m_Advance.field_0.x + (pCursor->m_CursorPos).field_0.x;
    fVar14 = fVar14 + pCVar3[(long)iVar1 + -1].m_Advance.field_1.y +
                      (pCursor->m_CursorPos).field_1.y;
    vVar13.field_0.x =
         pCVar3[(long)iVar1 + -1].m_Size *
         (fVar12 + (pCVar3[(long)iVar1 + -1].m_pGlyph)->m_AdvanceX);
    vVar13.field_1.y = pCVar3[(long)iVar1 + -1].m_Size * 0.0;
  }
  aVar9.x = fVar8 + vVar13.field_0.x;
  aVar10.y = fVar14 + vVar13.field_1.y;
LAB_00132438:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  vVar4.field_1.y = aVar10.y;
  vVar4.field_0.x = aVar9.x;
  return vVar4;
}

Assistant:

vec2 CTextRender::CaretPosition(CTextCursor *pCursor, int NumChars)
{
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;

	int NumGlyphs = pCursor->m_Glyphs.size();
	float LineWidth;
	int GlyphIndex = CharToGlyph(pCursor, NumChars, &LineWidth);

	int HorizontalAlign = pCursor->m_Align & TEXTALIGN_MASK_HORI;
	int VerticalAlign = pCursor->m_Align & TEXTALIGN_MASK_VERT;

	vec2 Offset = vec2(0,0);
	float LineOffset = 0.0f;

	if(HorizontalAlign == TEXTALIGN_RIGHT)
	{
		Offset.x = -pCursor->m_Width;
		LineOffset = pCursor->m_Width - LineWidth;
	}
	else if(HorizontalAlign == TEXTALIGN_CENTER)
	{
		Offset.x = -pCursor->m_Width / 2.0f;
		LineOffset = (pCursor->m_Width - LineWidth) / 2.0f;
	}

	if(VerticalAlign == TEXTALIGN_BOTTOM)
		Offset.y = -pCursor->m_Height + Size * 1.35f;
	else if(VerticalAlign == TEXTALIGN_MIDDLE)
		Offset.y = -pCursor->m_Height / 2.0f + Size * 0.675f;

	if(GlyphIndex == 0 || NumGlyphs == 0)
		return pCursor->m_CursorPos + Offset;

	if(GlyphIndex < NumGlyphs)
		return pCursor->m_CursorPos + pCursor->m_Glyphs[GlyphIndex].m_Advance + Offset;

	CScaledGlyph *pLastScaled = &pCursor->m_Glyphs[NumGlyphs-1];
	return pCursor->m_CursorPos + pLastScaled->m_Advance + Offset
		+ vec2(pLastScaled->m_pGlyph->m_AdvanceX + LineOffset, 0) * pLastScaled->m_Size;
}